

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryKinematicsScenesLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryKinematicsScenesLoader::begin__instance_articulated_system
          (LibraryKinematicsScenesLoader *this,
          instance_articulated_system__AttributeData *attributeData)

{
  URI *this_00;
  KinematicsInstanceArticulatedSystem *instanceArticulatedSystem_00;
  long in_RSI;
  long *in_RDI;
  KinematicsInstanceArticulatedSystem *instanceArticulatedSystem;
  URI absoluteUrl;
  String *in_stack_ffffffffffffff20;
  URI *in_stack_ffffffffffffff28;
  URI *in_stack_ffffffffffffff30;
  URI *in_stack_ffffffffffffffd8;
  KinematicsInstanceArticulatedSystem *in_stack_ffffffffffffffe0;
  
  this_00 = (URI *)(**(code **)(*in_RDI + 0x58))();
  COLLADABU::URI::getURIString_abi_cxx11_((URI *)(in_RSI + 0x10));
  COLLADABU::URI::URI(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20)
  ;
  instanceArticulatedSystem_00 = (KinematicsInstanceArticulatedSystem *)operator_new(0x150);
  KinematicsInstanceArticulatedSystem::KinematicsInstanceArticulatedSystem
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  InstanceArticulatedSystemLoader::setInstanceArticulatedSystem
            ((InstanceArticulatedSystemLoader *)(in_RDI + 5),instanceArticulatedSystem_00);
  COLLADABU::URI::~URI(this_00);
  return true;
}

Assistant:

bool LibraryKinematicsScenesLoader::begin__instance_articulated_system( const instance_articulated_system__AttributeData& attributeData )
	{
		COLLADABU::URI absoluteUrl(getFileUri(), attributeData.url.getURIString());

		KinematicsInstanceArticulatedSystem* instanceArticulatedSystem = new KinematicsInstanceArticulatedSystem(absoluteUrl);
		mInstanceArticulatedSystemLoader.setInstanceArticulatedSystem(instanceArticulatedSystem);
		return true;
	}